

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveFinder.cpp
# Opt level: O0

void __thiscall
senjo::MoveFinder::AddOrigins
          (MoveFinder *this,char pc,int x,int y,
          set<senjo::Square,_std::less<senjo::Square>,_std::allocator<senjo::Square>_> *origins)

{
  set<senjo::Square,_std::less<senjo::Square>,_std::allocator<senjo::Square>_> *psVar1;
  pair<std::_Rb_tree_const_iterator<senjo::Square>,_bool> pVar2;
  Square local_74;
  _Base_ptr local_70;
  undefined1 local_68;
  Square local_5c;
  _Base_ptr local_58;
  undefined1 local_50;
  Square local_44 [6];
  Square local_2c;
  set<senjo::Square,_std::less<senjo::Square>,_std::allocator<senjo::Square>_> *local_28;
  set<senjo::Square,_std::less<senjo::Square>,_std::allocator<senjo::Square>_> *origins_local;
  int local_18;
  int y_local;
  int x_local;
  char pc_local;
  MoveFinder *this_local;
  
  local_28 = origins;
  origins_local._4_4_ = y;
  y_local._3_1_ = pc;
  _x_local = this;
  if ((x < 0) || (7 < x)) {
    if ((y < 0) || (7 < y)) {
      for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
        for (origins_local._4_4_ = 0; psVar1 = local_28, origins_local._4_4_ < 8;
            origins_local._4_4_ = origins_local._4_4_ + 1) {
          if (this->board[local_18][origins_local._4_4_] == y_local._3_1_) {
            Square::Square(&local_74,local_18,origins_local._4_4_);
            std::set<senjo::Square,_std::less<senjo::Square>,_std::allocator<senjo::Square>_>::
            insert(psVar1,&local_74);
          }
        }
      }
    }
    else {
      for (local_18 = 0; psVar1 = local_28, local_18 < 8; local_18 = local_18 + 1) {
        if (this->board[local_18][origins_local._4_4_] == y_local._3_1_) {
          Square::Square(&local_5c,local_18,origins_local._4_4_);
          pVar2 = std::set<senjo::Square,_std::less<senjo::Square>,_std::allocator<senjo::Square>_>
                  ::insert(psVar1,&local_5c);
          local_70 = (_Base_ptr)pVar2.first._M_node;
          local_68 = pVar2.second;
        }
      }
    }
  }
  else {
    local_18 = x;
    if ((y < 0) || (7 < y)) {
      for (origins_local._4_4_ = 0; psVar1 = local_28, origins_local._4_4_ < 8;
          origins_local._4_4_ = origins_local._4_4_ + 1) {
        if (this->board[local_18][origins_local._4_4_] == y_local._3_1_) {
          Square::Square(local_44,local_18,origins_local._4_4_);
          pVar2 = std::set<senjo::Square,_std::less<senjo::Square>,_std::allocator<senjo::Square>_>
                  ::insert(psVar1,local_44);
          local_58 = (_Base_ptr)pVar2.first._M_node;
          local_50 = pVar2.second;
        }
      }
    }
    else if (this->board[x][y] == pc) {
      Square::Square(&local_2c,x,y);
      std::set<senjo::Square,_std::less<senjo::Square>,_std::allocator<senjo::Square>_>::insert
                (origins,&local_2c);
    }
  }
  return;
}

Assistant:

void MoveFinder::AddOrigins(const char pc, int x, int y,
                            std::set<Square>& origins) const
{
  if ((x >= 0) && (x < 8)) {
    if ((y >= 0) && (y < 8)) {
      if (board[x][y] == pc) {
        origins.insert(Square(x, y));
      }
    }
    else {
      for (y = 0; y < 8; ++y) {
        if (board[x][y] == pc) {
          origins.insert(Square(x, y));
        }
      }
    }
  }
  else if ((y >= 0) && (y < 8)) {
    for (x = 0; x < 8; ++x) {
      if (board[x][y] == pc) {
        origins.insert(Square(x, y));
      }
    }
  }
  else {
    for (x = 0; x < 8; ++x) {
      for (y = 0; y < 8; ++y) {
        if (board[x][y] == pc) {
          origins.insert(Square(x, y));
        }
      }
    }
  }
}